

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getQuoted(Nibbler *this,char c,string *result,bool quote)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  char cVar6;
  char cVar7;
  ulong uVar8;
  
  std::__cxx11::string::assign((char *)result);
  uVar5 = this->_length;
  uVar8 = this->_cursor;
  if ((uVar8 < uVar5) && ((this->_input)._M_dataplus._M_p[uVar8] == c)) {
    bVar3 = false;
    bVar2 = false;
    cVar6 = '\0';
    for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
      cVar1 = (this->_input)._M_dataplus._M_p[uVar8];
      bVar4 = bVar3;
      if ((cVar1 != '\\') || (bVar2)) {
        cVar7 = (char)result;
        if ((cVar1 != c) || (bVar2)) {
          if (cVar6 != '\0') {
            std::__cxx11::string::push_back(cVar7);
          }
          std::__cxx11::string::push_back(cVar7);
          bVar2 = false;
          cVar6 = '\0';
        }
        else {
          if (quote) {
            std::__cxx11::string::push_back(cVar7);
          }
          bVar4 = true;
          if (bVar3) {
            this->_cursor = uVar8 + 1;
            return true;
          }
        }
      }
      else {
        cVar6 = '\\';
        bVar2 = true;
      }
      bVar3 = bVar4;
      uVar5 = this->_length;
    }
  }
  return false;
}

Assistant:

bool Nibbler::getQuoted (
  char c,
  std::string& result,
  bool quote /* = false */)
{
  bool inquote = false;
  bool inescape = false;
  char previous = 0;
  char current = 0;
  result = "";

  if (_cursor >= _length ||
      _input[_cursor] != c)
  {
    return false;
  }

  for (std::string::size_type i = _cursor; i < _length; ++i)
  {
    current = _input[i];

    if (current == '\\' && !inescape)
    {
      inescape = true;
      previous = current;
      continue;
    }

    if (current == c && !inescape)
    {
      if (quote)
        result += current;

      if (!inquote)
      {
        inquote = true;
      }
      else
      {
        _cursor = i + 1;
        return true;
      }
    }
    else
    {
      if (previous)
      {
        result += previous;
        previous = 0;
      }

      result += current;
      inescape = false;
    }
  }

  return false;
}